

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

void __thiscall
soplex::SLUFactor<double>::solveLeft
          (SLUFactor<double> *this,SSVectorBase<double> *x,SSVectorBase<double> *y,
          SSVectorBase<double> *z,SVectorBase<double> *rhs1,SSVectorBase<double> *rhs2,
          SSVectorBase<double> *rhs3)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pdVar4;
  int *piVar5;
  double *vec;
  int *ridx2;
  int *idx3;
  double *vec3;
  SSVectorBase<double> *pSVar6;
  SSVectorBase<double> *pSVar7;
  long lVar8;
  Real RVar9;
  int n3;
  SSVectorBase<double> *local_90;
  SSVectorBase<double> *local_88;
  int n2;
  int n1;
  SSVectorBase<double> *local_78;
  undefined8 uStack_70;
  int *local_68;
  double *local_60;
  CLUFactor<double> *local_58;
  Real local_50;
  SSVectorBase<double> *local_48;
  int *local_40;
  pointer local_38;
  
  local_88 = y;
  (*this->solveTime->_vptr_Timer[3])();
  (this->ssvec).setupStatus = false;
  local_38 = (this->ssvec).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_40 = (this->ssvec).super_IdxSet.idx;
  this_00 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_50 = Tolerances::epsilon(this_00);
  local_90 = rhs2;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  local_58 = &this->super_CLUFactor<double>;
  SSVectorBase<double>::clear(x);
  SSVectorBase<double>::clear(local_88);
  local_48 = z;
  SSVectorBase<double>::clear(z);
  iVar1 = rhs1->memused;
  (this->ssvec).super_IdxSet.num = 0;
  if (0 < (long)iVar1) {
    lVar8 = 0;
    do {
      iVar2 = *(int *)((long)&rhs1->m_elem->idx + lVar8);
      local_78 = *(SSVectorBase<double> **)((long)&rhs1->m_elem->val + lVar8);
      uStack_70 = 0;
      RVar9 = Tolerances::epsilon((this->ssvec)._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      pdVar4 = (this->ssvec).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (ABS((double)local_78) <= RVar9) {
        pdVar4[iVar2] = 0.0;
      }
      else {
        pdVar4[iVar2] = (double)local_78;
        piVar5 = (this->ssvec).super_IdxSet.idx;
        iVar3 = (this->ssvec).super_IdxSet.num;
        (this->ssvec).super_IdxSet.num = iVar3 + 1;
        piVar5[iVar3] = iVar2;
      }
      lVar8 = lVar8 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar8);
  }
  pSVar7 = local_48;
  pSVar6 = local_88;
  (this->ssvec).setupStatus = true;
  n1 = (this->ssvec).super_IdxSet.num;
  n2 = (local_90->super_IdxSet).num;
  n3 = (rhs3->super_IdxSet).num;
  x->setupStatus = false;
  piVar5 = (x->super_IdxSet).idx;
  vec = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start;
  local_88->setupStatus = false;
  local_68 = (local_88->super_IdxSet).idx;
  local_60 = (local_88->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_90->setupStatus = false;
  ridx2 = (local_90->super_IdxSet).idx;
  local_90 = (SSVectorBase<double> *)
             (local_90->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_48->setupStatus = false;
  idx3 = (local_48->super_IdxSet).idx;
  vec3 = (local_48->super_VectorBase<double>).val.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
  rhs3->setupStatus = false;
  local_78 = x;
  CLUFactor<double>::vSolveLeft3sparse
            (local_58,local_50,vec,piVar5,local_38,local_40,&n1,local_60,local_68,(double *)local_90
             ,ridx2,&n2,vec3,idx3,
             (rhs3->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,(rhs3->super_IdxSet).idx,&n3);
  local_78->setupStatus = false;
  (local_78->super_IdxSet).num = n1;
  pSVar6->setupStatus = false;
  (pSVar6->super_IdxSet).num = n2;
  pSVar7->setupStatus = false;
  (pSVar7->super_IdxSet).num = n3;
  if (0 < n1) {
    local_78->setupStatus = true;
  }
  if (0 < n2) {
    local_88->setupStatus = true;
  }
  if (0 < n3) {
    pSVar7->setupStatus = true;
  }
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 3;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solveLeft(
   SSVectorBase<R>&       x,
   SSVectorBase<R>&       y,
   SSVectorBase<R>&       z,
   const SVectorBase<R>& rhs1,
   SSVectorBase<R>&       rhs2,
   SSVectorBase<R>&       rhs3)
{

   solveTime->start();

   int   n1, n2, n3;
   R* svec = ssvec.altValues();
   int*  sidx = ssvec.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   z.clear();
   ssvec.assign(rhs1);
   n1 = ssvec.size(); // see altValues();
   n2 = rhs2.size();
   n3 = rhs3.size();
   this->vSolveLeft3sparse(epsilon,
                           x.altValues(), x.altIndexMem(),
                           svec, sidx, n1,
                           y.altValues(), y.altIndexMem(),
                           rhs2.altValues(), rhs2.altIndexMem(), n2,
                           z.altValues(), z.altIndexMem(),
                           rhs3.altValues(), rhs3.altIndexMem(), n3);
   x.setSize(n1);
   y.setSize(n2);
   z.setSize(n3);

   if(n1 > 0)
      x.forceSetup();

   if(n2 > 0)
      y.forceSetup();

   if(n3 > 0)
      z.forceSetup();

   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 3;
   solveTime->stop();
}